

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O0

void generalInterfaceExamples(void)

{
  ostream *poVar1;
  Array2D<GZ> *this;
  int *in_stack_00000008;
  int *in_stack_00000010;
  Array2D<GZ> *in_stack_00000018;
  char *in_stack_00000020;
  int *in_stack_00000048;
  int *in_stack_00000050;
  int in_stack_00000058;
  int in_stack_0000005c;
  Array2D<Imath_3_2::half> *in_stack_00000060;
  int in_stack_00000068;
  int in_stack_0000006c;
  float *in_stack_00000070;
  half *in_stack_00000078;
  Array2D<GZ> gzp;
  Array2D<Imath_3_2::half> rp;
  Array2D<float> zp;
  Array2D<Imath_3_2::half> gp;
  int h;
  int w;
  Vec2<int> *in_stack_fffffffffffffef0;
  long in_stack_fffffffffffffef8;
  Vec2<int> *this_00;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff00;
  Array2D<GZ> *this_01;
  undefined8 in_stack_ffffffffffffff20;
  Array2D<float> *in_stack_ffffffffffffff28;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff30;
  Array2D<GZ> local_64;
  Array2D<float> local_38;
  Array2D<Imath_3_2::half> local_20;
  int local_8;
  int local_4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nGZ (green, depth) images\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"drawing image");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_4 = 800;
  local_8 = 600;
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(long)in_stack_fffffffffffffef0);
  Imf_3_2::Array2D<float>::Array2D
            ((Array2D<float> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (long)in_stack_fffffffffffffef0);
  drawImage2(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(int)in_stack_ffffffffffffff20);
  poVar1 = std::operator<<((ostream *)&std::cout,"writing entire image");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,0);
  Imf_3_2::Array2D<float>::operator[](&local_38,0);
  writeGZ1((char *)in_stack_00000070,(half *)CONCAT44(in_stack_0000006c,in_stack_00000068),
           (float *)in_stack_00000060,in_stack_0000005c,in_stack_00000058);
  poVar1 = std::operator<<((ostream *)&std::cout,"writing cropped image");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_20,0);
  Imf_3_2::Array2D<float>::operator[](&local_38,0);
  this_00 = (Vec2<int> *)&local_64._sizeY;
  Imath_3_2::Vec2<int>::Vec2(this_00,local_4 / 6,local_8 / 6);
  this_01 = &local_64;
  Imath_3_2::Vec2<int>::Vec2((Vec2<int> *)this_01,local_4 / 2,local_8 / 2);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)this_01,this_00,in_stack_fffffffffffffef0);
  writeGZ2((char *)gzp._sizeX,in_stack_00000078,in_stack_00000070,in_stack_0000006c,
           in_stack_00000068,(Box2i *)in_stack_00000060);
  this = (Array2D<GZ> *)
         std::operator<<((ostream *)&std::cout,"reading file into separate per-channel buffers");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)this_01,(long)this_00,(long)this);
  readGZ1((char *)in_stack_00000070,
          (Array2D<Imath_3_2::half> *)CONCAT44(in_stack_0000006c,in_stack_00000068),
          in_stack_00000060,(Array2D<float> *)CONCAT44(in_stack_0000005c,in_stack_00000058),
          in_stack_00000050,in_stack_00000048);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "reading file into interleaved multi-channel buffer");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::Array2D<GZ>::Array2D(this_01,(long)this_00,(long)this);
  readGZ2(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  Imf_3_2::Array2D<GZ>::~Array2D(this);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)this);
  Imf_3_2::Array2D<float>::~Array2D((Array2D<float> *)this);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)this);
  return;
}

Assistant:

void
generalInterfaceExamples ()
{
    cout << "\nGZ (green, depth) images\n" << endl;
    cout << "drawing image" << endl;

    int w = 800;
    int h = 600;

    Array2D<half>  gp (h, w);
    Array2D<float> zp (h, w);
    drawImage2 (gp, zp, w, h);

    cout << "writing entire image" << endl;

    writeGZ1 ("gz1.exr", &gp[0][0], &zp[0][0], w, h);

    cout << "writing cropped image" << endl;

    writeGZ2 (
        "gz2.exr",
        &gp[0][0],
        &zp[0][0],
        w,
        h,
        Box2i (V2i (w / 6, h / 6), V2i (w / 2, h / 2)));

    cout << "reading file into separate per-channel buffers" << endl;

    Array2D<half> rp (1, 1);
    readGZ1 ("gz2.exr", rp, gp, zp, w, h);

    cout << "reading file into interleaved multi-channel buffer" << endl;

    Array2D<GZ> gzp (1, 1);
    readGZ2 ("gz2.exr", gzp, w, h);
}